

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdExtractEcdsaAdaptorSecret
              (void *handle,char *adaptor_signature,char *signature,char *adaptor,
              char **adaptor_secret)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Privkey secret;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  undefined1 local_f8 [32];
  string local_d8;
  Pubkey local_b8;
  ByteData local_a0;
  AdaptorSignature local_88;
  string local_70;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(adaptor_signature);
  if (bVar1) {
    local_f8._0_8_ = "cfdcapi_key.cpp";
    local_f8._8_4_ = 0x13d;
    local_f8._16_8_ = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_f8,kCfdLogLevelWarning,
               "adaptor_signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Failed to parameter. adaptor_signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    local_f8._0_8_ = "cfdcapi_key.cpp";
    local_f8._8_4_ = 0x143;
    local_f8._16_8_ = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_f8,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(adaptor);
  if (bVar1) {
    local_f8._0_8_ = "cfdcapi_key.cpp";
    local_f8._8_4_ = 0x149;
    local_f8._16_8_ = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_f8,kCfdLogLevelWarning,"adaptor is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Failed to parameter. adaptor is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (adaptor_secret != (char **)0x0) {
    std::__cxx11::string::string((string *)&local_d8,adaptor_signature,&local_f9);
    cfd::core::AdaptorSignature::AdaptorSignature(&local_88,&local_d8);
    std::__cxx11::string::string((string *)&local_50,signature,&local_fa);
    cfd::core::ByteData::ByteData(&local_a0,&local_50);
    std::__cxx11::string::string((string *)&local_70,adaptor,&local_fb);
    cfd::core::Pubkey::Pubkey(&local_b8,&local_70);
    cfd::core::AdaptorUtil::ExtractSecret((Privkey *)local_f8,&local_88,&local_a0,&local_b8);
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_d8,(Privkey *)local_f8);
    pcVar2 = cfd::capi::CreateString(&local_d8);
    *adaptor_secret = pcVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((pointer)local_f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_f8._0_8_);
    }
    return 0;
  }
  local_f8._0_8_ = "cfdcapi_key.cpp";
  local_f8._8_4_ = 0x14f;
  local_f8._16_8_ = "CfdExtractEcdsaAdaptorSecret";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_f8,kCfdLogLevelWarning,"adaptor_secret is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"Failed to parameter. adaptor_secret is null.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f8);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdExtractEcdsaAdaptorSecret(
    void* handle, const char* adaptor_signature, const char* signature,
    const char* adaptor, char** adaptor_secret) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (adaptor_secret == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor_secret is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_secret is null.");
    }

    Privkey secret = AdaptorUtil::ExtractSecret(
        AdaptorSignature(adaptor_signature), ByteData(signature),
        Pubkey(adaptor));

    *adaptor_secret = CreateString(secret.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}